

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOFX_masteringlimiter.c
# Opt level: O0

uint32_t FAPOFXCreateMasteringLimiter
                   (FAPO **pEffect,void *pInitData,uint32_t InitDataByteSize,
                   FAudioMallocFunc customMalloc,FAudioFreeFunc customFree,
                   FAudioReallocFunc customRealloc,uint8_t legacy)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  FAPOBase *fapo;
  uint8_t *pParameterBlocks;
  FAudioMallocFunc in_RCX;
  uint in_EDX;
  long in_RSI;
  FAPORegistrationProperties *pRegistrationProperties;
  undefined8 *in_RDI;
  FAudioFreeFunc in_R8;
  FAudioReallocFunc in_R9;
  char in_stack_00000008;
  SDL_AssertState sdl_assert_state;
  uint8_t *params;
  FAPOFXMasteringLimiter *result;
  FAPOFXMasteringLimiterParameters fxdefault;
  undefined8 local_38;
  FAudioReallocFunc local_30;
  FAudioFreeFunc local_28;
  FAudioMallocFunc local_20;
  uint local_14;
  long local_10;
  undefined8 *local_8;
  
  local_38 = 0x3e800000006;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fapo = (FAPOBase *)(*in_RCX)(0xe0);
  pParameterBlocks = (uint8_t *)(*local_20)(0x18);
  if (local_10 == 0) {
    SDL_memset(pParameterBlocks,0,0x18);
    SDL_memcpy(pParameterBlocks,&local_38,8);
    SDL_memcpy(pParameterBlocks + 8,&local_38,8);
    SDL_memcpy(pParameterBlocks + 0x10,&local_38,8);
  }
  else {
    do {
      if (local_14 == 8) goto LAB_00123e5e;
      iVar2 = SDL_ReportAssertion(&FAPOFXCreateMasteringLimiter::sdl_assert_data,
                                  "FAPOFXCreateMasteringLimiter",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAPOFX_masteringlimiter.c"
                                  ,0xcf);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return uVar3;
    }
LAB_00123e5e:
    SDL_memcpy(pParameterBlocks,local_10,local_14);
    SDL_memcpy(pParameterBlocks + local_14,local_10,local_14);
    SDL_memcpy(pParameterBlocks + (local_14 << 1),local_10,local_14);
  }
  SDL_memcpy(&FXMasteringLimiterProperties_LEGACY,&FAPOFX_CLSID_FXMasteringLimiter_LEGACY,0x10);
  SDL_memcpy(&FXMasteringLimiterProperties,&FAPOFX_CLSID_FXMasteringLimiter,0x10);
  pRegistrationProperties = &FXMasteringLimiterProperties;
  if (in_stack_00000008 != '\0') {
    pRegistrationProperties = &FXMasteringLimiterProperties_LEGACY;
  }
  CreateFAPOBaseWithCustomAllocatorEXT
            (fapo,pRegistrationProperties,pParameterBlocks,8,'\0',local_20,local_28,local_30);
  (fapo->base).Initialize = FAPOFXMasteringLimiter_Initialize;
  (fapo->base).Process = FAPOFXMasteringLimiter_Process;
  fapo->Destructor = FAPOFXMasteringLimiter_Free;
  *local_8 = fapo;
  return 0;
}

Assistant:

uint32_t FAPOFXCreateMasteringLimiter(
	FAPO **pEffect,
	const void *pInitData,
	uint32_t InitDataByteSize,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc,
	uint8_t legacy
) {
	const FAPOFXMasteringLimiterParameters fxdefault =
	{
		FAPOFXMASTERINGLIMITER_DEFAULT_RELEASE,
		FAPOFXMASTERINGLIMITER_DEFAULT_LOUDNESS
	};

	/* Allocate... */
	FAPOFXMasteringLimiter *result = (FAPOFXMasteringLimiter*) customMalloc(
		sizeof(FAPOFXMasteringLimiter)
	);
	uint8_t *params = (uint8_t*) customMalloc(
		sizeof(FAPOFXMasteringLimiterParameters) * 3
	);
	if (pInitData == NULL)
	{
		FAudio_zero(params, sizeof(FAPOFXMasteringLimiterParameters) * 3);
		#define INITPARAMS(offset) \
			FAudio_memcpy( \
				params + sizeof(FAPOFXMasteringLimiterParameters) * offset, \
				&fxdefault, \
				sizeof(FAPOFXMasteringLimiterParameters) \
			);
		INITPARAMS(0)
		INITPARAMS(1)
		INITPARAMS(2)
		#undef INITPARAMS
	}
	else
	{
		FAudio_assert(InitDataByteSize == sizeof(FAPOFXMasteringLimiterParameters));
		FAudio_memcpy(params, pInitData, InitDataByteSize);
		FAudio_memcpy(params + InitDataByteSize, pInitData, InitDataByteSize);
		FAudio_memcpy(params + (InitDataByteSize * 2), pInitData, InitDataByteSize);
	}

	/* Initialize... */
	FAudio_memcpy(
		&FXMasteringLimiterProperties_LEGACY.clsid,
		&FAPOFX_CLSID_FXMasteringLimiter_LEGACY,
		sizeof(FAudioGUID)
	);
	FAudio_memcpy(
		&FXMasteringLimiterProperties.clsid,
		&FAPOFX_CLSID_FXMasteringLimiter,
		sizeof(FAudioGUID)
	);
	CreateFAPOBaseWithCustomAllocatorEXT(
		&result->base,
		legacy ? &FXMasteringLimiterProperties_LEGACY : &FXMasteringLimiterProperties,
		params,
		sizeof(FAPOFXMasteringLimiterParameters),
		0,
		customMalloc,
		customFree,
		customRealloc
	);

	/* Function table... */
	result->base.base.Initialize = (InitializeFunc)
		FAPOFXMasteringLimiter_Initialize;
	result->base.base.Process = (ProcessFunc)
		FAPOFXMasteringLimiter_Process;
	result->base.Destructor = FAPOFXMasteringLimiter_Free;

	/* Finally. */
	*pEffect = &result->base.base;
	return 0;
}